

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath
          (ScriptContextOptimizationOverrideInfo *this)

{
  bool bVar1;
  ScriptContextOptimizationOverrideInfo *this_local;
  
  if (this->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
    this->arraySetElementFastPathVtable = 1;
    this->intArraySetElementFastPathVtable = 1;
    this->floatArraySetElementFastPathVtable = 1;
  }
  else {
    bVar1 = IsEnabledArraySetElementFastPath(this);
    if (bVar1) {
      ForEachCrossSiteInfo<Js::ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath()::__0>
                (this);
    }
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath()
{
    if (this->crossSiteRoot == nullptr)
    {
        arraySetElementFastPathVtable = InvalidVtable;
        intArraySetElementFastPathVtable = InvalidVtable;
        floatArraySetElementFastPathVtable = InvalidVtable;
    }
    else if (IsEnabledArraySetElementFastPath())
    {
        // disable for all script context in the cross site group
        ForEachCrossSiteInfo([](ScriptContextOptimizationOverrideInfo * info)
        {
            Assert(info->IsEnabledArraySetElementFastPath());
            info->arraySetElementFastPathVtable = InvalidVtable;
            info->intArraySetElementFastPathVtable = InvalidVtable;
            info->floatArraySetElementFastPathVtable = InvalidVtable;
        });
    }
}